

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  PaDeviceInfo *pPVar1;
  char *pcVar2;
  double local_90;
  double average;
  SAMPLE val;
  SAMPLE max;
  int numBytes;
  int numSamples;
  int totalFrames;
  int i;
  paTestData data;
  PaStream *pPStack_58;
  PaError err;
  PaStream *stream;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  
  data.recordedSamples._4_4_ = 0;
  printf("patest_record.c\n");
  fflush(_stdout);
  i = 0x35d54;
  totalFrames = 0;
  data._0_8_ = malloc(0x1aeaa0);
  if ((void *)data._0_8_ == (void *)0x0) {
    printf("Could not allocate record array.\n");
  }
  else {
    for (numSamples = 0; numSamples < 0x6baa8; numSamples = numSamples + 1) {
      *(undefined4 *)(data._0_8_ + (long)numSamples * 4) = 0;
    }
    data.recordedSamples._4_4_ = Pa_Initialize();
    if (data.recordedSamples._4_4_ == 0) {
      outputParameters.hostApiSpecificStreamInfo._0_4_ = Pa_GetDefaultInputDevice();
      if ((PaDeviceIndex)outputParameters.hostApiSpecificStreamInfo == -1) {
        fprintf(_stderr,"Error: No default input device.\n");
      }
      else {
        outputParameters.hostApiSpecificStreamInfo._4_4_ = 2;
        Pa_GetDeviceInfo((PaDeviceIndex)outputParameters.hostApiSpecificStreamInfo);
        data.recordedSamples._4_4_ =
             Pa_OpenStream(&stack0xffffffffffffffa8,
                           (PaStreamParameters *)&outputParameters.hostApiSpecificStreamInfo,
                           (PaStreamParameters *)0x0,44100.0,0x200,1,recordCallback,&totalFrames);
        if ((data.recordedSamples._4_4_ == 0) &&
           (data.recordedSamples._4_4_ = Pa_StartStream(pPStack_58), data.recordedSamples._4_4_ == 0
           )) {
          printf("\n=== Now recording!! Please speak into the microphone. ===\n");
          fflush(_stdout);
          while (data.recordedSamples._4_4_ = Pa_IsStreamActive(pPStack_58),
                data.recordedSamples._4_4_ == 1) {
            Pa_Sleep(1000);
            printf("index = %d\n",(ulong)(uint)totalFrames);
            fflush(_stdout);
          }
          if ((-1 < (int)data.recordedSamples._4_4_) &&
             (data.recordedSamples._4_4_ = Pa_CloseStream(pPStack_58),
             data.recordedSamples._4_4_ == 0)) {
            average._4_4_ = 0.0;
            local_90 = 0.0;
            for (numSamples = 0; numSamples < 0x6baa8; numSamples = numSamples + 1) {
              average._0_4_ = *(float *)(data._0_8_ + (long)numSamples * 4);
              if (average._0_4_ < 0.0) {
                average._0_4_ = -average._0_4_;
              }
              if (average._4_4_ < average._0_4_) {
                average._4_4_ = average._0_4_;
              }
              local_90 = (double)average._0_4_ + local_90;
            }
            printf("sample max amplitude = %.8f\n",(double)average._4_4_);
            printf("sample average = %lf\n",local_90 / 441000.0);
            totalFrames = 0;
            stream._0_4_ = Pa_GetDefaultOutputDevice();
            if ((PaDeviceIndex)stream == -1) {
              fprintf(_stderr,"Error: No default output device.\n");
            }
            else {
              stream._4_4_ = 2;
              outputParameters.device = 1;
              outputParameters.channelCount = 0;
              pPVar1 = Pa_GetDeviceInfo((PaDeviceIndex)stream);
              outputParameters.sampleFormat = (PaSampleFormat)pPVar1->defaultLowOutputLatency;
              outputParameters.suggestedLatency = 0.0;
              printf("\n=== Now playing back. ===\n");
              fflush(_stdout);
              data.recordedSamples._4_4_ =
                   Pa_OpenStream(&stack0xffffffffffffffa8,(PaStreamParameters *)0x0,
                                 (PaStreamParameters *)&stream,44100.0,0x200,1,playCallback,
                                 &totalFrames);
              if (((data.recordedSamples._4_4_ == 0) && (pPStack_58 != (PaStream *)0x0)) &&
                 (data.recordedSamples._4_4_ = Pa_StartStream(pPStack_58),
                 data.recordedSamples._4_4_ == 0)) {
                printf("Waiting for playback to finish.\n");
                fflush(_stdout);
                while (data.recordedSamples._4_4_ = Pa_IsStreamActive(pPStack_58),
                      data.recordedSamples._4_4_ == 1) {
                  Pa_Sleep(100);
                }
                if ((-1 < (int)data.recordedSamples._4_4_) &&
                   (data.recordedSamples._4_4_ = Pa_CloseStream(pPStack_58),
                   data.recordedSamples._4_4_ == 0)) {
                  printf("Done.\n");
                  fflush(_stdout);
                }
              }
            }
          }
        }
      }
    }
  }
  Pa_Terminate();
  if (data._0_8_ != 0) {
    free((void *)data._0_8_);
  }
  if (data.recordedSamples._4_4_ != 0) {
    fprintf(_stderr,"An error occured while using the portaudio stream\n");
    fprintf(_stderr,"Error number: %d\n",(ulong)data.recordedSamples._4_4_);
    __stream = _stderr;
    pcVar2 = Pa_GetErrorText(data.recordedSamples._4_4_);
    fprintf(__stream,"Error message: %s\n",pcVar2);
    data.recordedSamples._4_4_ = 1;
  }
  return data.recordedSamples._4_4_;
}

Assistant:

int main(void)
{
    PaStreamParameters  inputParameters,
                        outputParameters;
    PaStream*           stream;
    PaError             err = paNoError;
    paTestData          data;
    int                 i;
    int                 totalFrames;
    int                 numSamples;
    int                 numBytes;
    SAMPLE              max, val;
    double              average;

    printf("patest_record.c\n"); fflush(stdout);

    data.maxFrameIndex = totalFrames = NUM_SECONDS * SAMPLE_RATE; /* Record for a few seconds. */
    data.frameIndex = 0;
    numSamples = totalFrames * NUM_CHANNELS;
    numBytes = numSamples * sizeof(SAMPLE);
    data.recordedSamples = (SAMPLE *) malloc( numBytes ); /* From now on, recordedSamples is initialised. */
    if( data.recordedSamples == NULL )
    {
        printf("Could not allocate record array.\n");
        goto done;
    }
    for( i=0; i<numSamples; i++ ) data.recordedSamples[i] = 0;

    err = Pa_Initialize();
    if( err != paNoError ) goto done;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default input device.\n");
        goto done;
    }
    inputParameters.channelCount = 2;                    /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    /* Record some audio. -------------------------------------------- */
    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              NULL,                  /* &outputParameters, */
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              recordCallback,
              &data );
    if( err != paNoError ) goto done;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto done;
    printf("\n=== Now recording!! Please speak into the microphone. ===\n"); fflush(stdout);

    while( ( err = Pa_IsStreamActive( stream ) ) == 1 )
    {
        Pa_Sleep(1000);
        printf("index = %d\n", data.frameIndex ); fflush(stdout);
    }
    if( err < 0 ) goto done;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto done;

    /* Measure maximum peak amplitude. */
    max = 0;
    average = 0.0;
    for( i=0; i<numSamples; i++ )
    {
        val = data.recordedSamples[i];
        if( val < 0 ) val = -val; /* ABS */
        if( val > max )
        {
            max = val;
        }
        average += val;
    }

    average = average / (double)numSamples;

    printf("sample max amplitude = "PRINTF_S_FORMAT"\n", max );
    printf("sample average = %lf\n", average );

    /* Write recorded data to a file. */
#if WRITE_TO_FILE
    {
        FILE  *fid;
        fid = fopen("recorded.raw", "wb");
        if( fid == NULL )
        {
            printf("Could not open file.");
        }
        else
        {
            fwrite( data.recordedSamples, NUM_CHANNELS * sizeof(SAMPLE), totalFrames, fid );
            fclose( fid );
            printf("Wrote data to 'recorded.raw'\n");
        }
    }
#endif

    /* Playback recorded data.  -------------------------------------------- */
    data.frameIndex = 0;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default output device.\n");
        goto done;
    }
    outputParameters.channelCount = 2;                     /* stereo output */
    outputParameters.sampleFormat =  PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    printf("\n=== Now playing back. ===\n"); fflush(stdout);
    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              playCallback,
              &data );
    if( err != paNoError ) goto done;

    if( stream )
    {
        err = Pa_StartStream( stream );
        if( err != paNoError ) goto done;
        
        printf("Waiting for playback to finish.\n"); fflush(stdout);

        while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) Pa_Sleep(100);
        if( err < 0 ) goto done;
        
        err = Pa_CloseStream( stream );
        if( err != paNoError ) goto done;
        
        printf("Done.\n"); fflush(stdout);
    }

done:
    Pa_Terminate();
    if( data.recordedSamples )       /* Sure it is NULL or valid. */
        free( data.recordedSamples );
    if( err != paNoError )
    {
        fprintf( stderr, "An error occured while using the portaudio stream\n" );
        fprintf( stderr, "Error number: %d\n", err );
        fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
        err = 1;          /* Always return 0 or 1, but no other return codes. */
    }
    return err;
}